

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedObjects.hpp
# Opt level: O0

void __thiscall
gmlc::concurrency::DelayedObjects<int>::fulfillAllPromises(DelayedObjects<int> *this,int *val)

{
  bool bVar1;
  reference __k;
  mapped_type *this_00;
  reference __k_00;
  mapped_type *this_01;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>_>
  *pr_1;
  iterator __end0_1;
  iterator __begin0_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>_>_>_>
  *__range3_1;
  pair<const_int,_std::promise<int>_> *pr;
  iterator __end0;
  iterator __begin0;
  map<int,_std::promise<int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<int>_>_>_>
  *__range3;
  lock_guard<std::mutex> lock;
  int *val_local;
  DelayedObjects<int> *this_local;
  
  lock._M_device = (mutex_type *)val;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&__range3,&this->promiseLock);
  __end0 = std::
           map<int,_std::promise<int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<int>_>_>_>
           ::begin(&this->promiseByInteger);
  pr = (pair<const_int,_std::promise<int>_> *)
       std::
       map<int,_std::promise<int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<int>_>_>_>
       ::end(&this->promiseByInteger);
  while( true ) {
    bVar1 = std::operator!=(&__end0,(_Self *)&pr);
    if (!bVar1) break;
    __k = std::_Rb_tree_iterator<std::pair<const_int,_std::promise<int>_>_>::operator*(&__end0);
    std::promise<int>::set_value(&__k->second,(int *)lock._M_device);
    this_00 = std::
              map<int,_std::promise<int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<int>_>_>_>
              ::operator[](&this->usedPromiseByInteger,&__k->first);
    std::promise<int>::operator=(this_00,&__k->second);
    std::_Rb_tree_iterator<std::pair<const_int,_std::promise<int>_>_>::operator++(&__end0);
  }
  __end0_1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>_>_>_>
             ::begin(&this->promiseByString);
  pr_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>_>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>_>_>_>
            ::end(&this->promiseByString);
  while( true ) {
    bVar1 = std::operator!=(&__end0_1,(_Self *)&pr_1);
    if (!bVar1) break;
    __k_00 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>_>_>
             ::operator*(&__end0_1);
    std::promise<int>::set_value(&__k_00->second,(int *)lock._M_device);
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>_>_>_>
              ::operator[](&this->usedPromiseByString,&__k_00->first);
    std::promise<int>::operator=(this_01,&__k_00->second);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>_>_>
    ::operator++(&__end0_1);
  }
  std::
  map<int,_std::promise<int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<int>_>_>_>
  ::clear(&this->promiseByInteger);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>_>_>_>
  ::clear(&this->promiseByString);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&__range3);
  return;
}

Assistant:

void fulfillAllPromises(const X& val)
    {
        std::lock_guard<std::mutex> lock(promiseLock);
        for (auto& pr : promiseByInteger) {
            pr.second.set_value(val);
            usedPromiseByInteger[pr.first] = std::move(pr.second);
        }
        for (auto& pr : promiseByString) {
            pr.second.set_value(val);
            usedPromiseByString[pr.first] = std::move(pr.second);
        }
        promiseByInteger.clear();
        promiseByString.clear();
    }